

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>::Matcher
          (Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&> *this,
          not_null<const_pstore::command_line::option_*> *value)

{
  MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&> local_28;
  
  (this->super_MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>).
  vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0019a128;
  local_28.buffer_ = (Buffer)value->ptr_;
  local_28.vtable_ =
       (VTable *)
       internal::MatcherBase<pstore::gsl::not_null<pstore::command_line::option_const*>const&>::
       GetVTable<testing::internal::MatcherBase<pstore::gsl::not_null<pstore::command_line::option_const*>const&>::ValuePolicy<testing::internal::EqMatcher<pstore::gsl::not_null<pstore::command_line::option_const*>>,true>>()
       ::kVTable;
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0019a128;
  internal::MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>::
  operator=(&this->
             super_MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,
            &local_28);
  internal::MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>::
  ~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }